

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMulti.c
# Opt level: O3

void Lpk_CreateVarOrder(Kit_DsdNtk_t *pNtk,char (*pTable) [16])

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  Kit_DsdObj_t *pKVar3;
  ushort uVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int Below [16];
  int Above [16];
  uint local_b8 [16];
  uint auStack_78 [18];
  
  uVar6 = pNtk->nNodes;
  if (uVar6 != 0) {
    uVar5 = 0;
    do {
      pKVar3 = pNtk->pNodes[uVar5];
      if (pKVar3 == (Kit_DsdObj_t *)0x0) {
        return;
      }
      KVar2 = *pKVar3;
      uVar7 = 0;
      uVar9 = 0;
      uVar10 = 0;
      if (0x3ffffff < (uint)KVar2) {
        uVar1 = pNtk->nVars;
        uVar13 = 0;
        uVar10 = 0;
        uVar9 = 0;
        do {
          uVar4 = *(ushort *)((long)&pKVar3[1].field_0x0 + uVar13 * 2) >> 1;
          uVar8 = (uint)uVar4;
          if ((uint)uVar6 + (uint)uVar1 <= uVar8) {
            __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kit.h"
                          ,0x9b,"int Kit_DsdLitIsLeaf(Kit_DsdNtk_t *, int)");
          }
          if (uVar4 < uVar1) {
            lVar12 = (long)(int)uVar9;
            uVar9 = uVar9 + 1;
            auStack_78[lVar12] = uVar8;
          }
          else {
            if (pNtk->pSupps == (uint *)0x0) {
              uVar8 = 0;
            }
            else {
              uVar8 = pNtk->pSupps[(ulong)uVar8 - (ulong)uVar1];
            }
            uVar10 = uVar10 | uVar8;
          }
          uVar13 = uVar13 + 1;
        } while ((uint)KVar2 >> 0x1a != uVar13);
      }
      uVar8 = 0;
      do {
        if ((uVar10 >> (uVar7 & 0x1f) & 1) != 0) {
          lVar12 = (long)(int)uVar8;
          uVar8 = uVar8 + 1;
          local_b8[lVar12] = uVar7;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != 0x10);
      if (0 < (int)uVar9) {
        uVar13 = 0;
        do {
          if (0 < (int)uVar8) {
            uVar7 = auStack_78[uVar13];
            uVar11 = 0;
            do {
              pTable[(int)uVar7][(int)local_b8[uVar11]] =
                   pTable[(int)uVar7][(int)local_b8[uVar11]] + '\x01';
              uVar11 = uVar11 + 1;
            } while (uVar8 != uVar11);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar9);
        uVar6 = pNtk->nNodes;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar6);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Records variable order.]

  Description [Increaments Order[x][y] by 1 if x should be above y in the DSD.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Lpk_CreateVarOrder( Kit_DsdNtk_t * pNtk, char pTable[][16] )
{
    Kit_DsdObj_t * pObj;
    unsigned uSuppFanins, k;
    int Above[16], Below[16];
    int nAbove, nBelow, iFaninLit, i, x, y;
    // iterate through the nodes
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
    {
        // collect fanin support of this node
        nAbove = 0;
        uSuppFanins = 0;
        Kit_DsdObjForEachFanin( pNtk, pObj, iFaninLit, k )
        {
            if ( Kit_DsdLitIsLeaf( pNtk, iFaninLit ) )
                Above[nAbove++] = Abc_Lit2Var(iFaninLit);
            else
                uSuppFanins |= Kit_DsdLitSupport( pNtk, iFaninLit );
        }
        // find the below variables
        nBelow = 0;
        for ( y = 0; y < 16; y++ )
            if ( uSuppFanins & (1 << y) )
                Below[nBelow++] = y;
        // create all pairs
        for ( x = 0; x < nAbove; x++ )
            for ( y = 0; y < nBelow; y++ )
                pTable[Above[x]][Below[y]]++;
    }
}